

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

bool __thiscall
raft_functional_common::TestSm::isSame(TestSm *this,TestSm *with,bool check_precommit)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  element_type *peVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte in_DL;
  ulong in_RSI;
  ulong in_RDI;
  ptr<buffer> e2_buf_1;
  ptr<buffer> e1_buf_1;
  const_iterator e2_1;
  pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_> *e1_1;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  *__range2;
  ptr<buffer> e2_buf;
  ptr<buffer> e1_buf;
  const_iterator e2;
  pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_> *e1;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  *__range3;
  lock_guard<std::mutex> ll_mine_1;
  lock_guard<std::mutex> ll_with_1;
  lock_guard<std::mutex> ll_with;
  lock_guard<std::mutex> ll_mine;
  map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  *in_stack_fffffffffffffe88;
  shared_ptr<nuraft::buffer> *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffea8;
  buffer *in_stack_fffffffffffffeb0;
  buffer *this_00;
  buffer local_e8 [16];
  _Self local_d8;
  _Self local_d0;
  reference local_c8;
  _Self local_c0;
  _Self local_b8;
  long local_b0;
  int local_a4;
  _Self local_80;
  _Self local_78;
  reference local_70;
  _Self local_68;
  _Self local_60;
  long local_58;
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  if (in_RDI < in_RSI) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe90,
               (mutex_type *)in_stack_fffffffffffffe88);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe90,
               (mutex_type *)in_stack_fffffffffffffe88);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x192a37);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x192a44);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe90,
               (mutex_type *)in_stack_fffffffffffffe88);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe90,
               (mutex_type *)in_stack_fffffffffffffe88);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x192aad);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x192aba);
  }
  if ((local_19 & 1) != 0) {
    sVar3 = std::
            map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
            ::size((map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                    *)0x192afe);
    sVar4 = std::
            map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
            ::size((map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                    *)0x192b14);
    if (sVar3 != sVar4) {
      local_1 = 0;
      goto LAB_001930b5;
    }
    local_58 = in_RDI + 8;
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
         ::begin(in_stack_fffffffffffffe88);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
         ::end(in_stack_fffffffffffffe88);
    while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
      local_70 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                              *)in_stack_fffffffffffffe90);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
           ::find(in_stack_fffffffffffffe88,(key_type *)0x192bb5);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
           ::end(in_stack_fffffffffffffe88);
      bVar1 = std::operator==(&local_78,&local_80);
      if (bVar1) {
        local_1 = 0;
        goto LAB_001930b5;
      }
      std::shared_ptr<nuraft::buffer>::shared_ptr
                (in_stack_fffffffffffffe90,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe88);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                  *)0x192c29);
      std::shared_ptr<nuraft::buffer>::shared_ptr
                (in_stack_fffffffffffffe90,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe88);
      peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x192c47);
      sVar6 = nuraft::buffer::size(peVar5);
      peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x192c63);
      sVar7 = nuraft::buffer::size(peVar5);
      if (sVar6 == sVar7) {
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x192cd9);
        nuraft::buffer::pos(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x192cf4);
        nuraft::buffer::pos(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x192d0f);
        pbVar8 = nuraft::buffer::data(peVar5);
        peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x192d2b);
        pbVar9 = nuraft::buffer::data(peVar5);
        peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x192d47);
        sVar6 = nuraft::buffer::size(peVar5);
        iVar2 = memcmp(pbVar8,pbVar9,sVar6);
        if (iVar2 == 0) {
          local_a4 = 0;
        }
        else {
          local_1 = 0;
          local_a4 = 1;
        }
      }
      else {
        local_1 = 0;
        local_a4 = 1;
      }
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x192d9c);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x192da9);
      if (local_a4 != 0) goto LAB_001930b5;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>::
      operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                  *)in_stack_fffffffffffffe90);
    }
  }
  sVar3 = std::
          map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
          ::size((map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                  *)0x192ddf);
  sVar4 = std::
          map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
          ::size((map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
                  *)0x192df5);
  if (sVar3 == sVar4) {
    local_b0 = in_RDI + 0x38;
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
         ::begin(in_stack_fffffffffffffe88);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
         ::end(in_stack_fffffffffffffe88);
    while (bVar1 = std::operator!=(&local_b8,&local_c0), bVar1) {
      local_c8 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                              *)in_stack_fffffffffffffe90);
      local_d0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
           ::find(in_stack_fffffffffffffe88,(key_type *)0x192e96);
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
           ::end(in_stack_fffffffffffffe88);
      bVar1 = std::operator==(&local_d0,&local_d8);
      if (bVar1) {
        local_1 = 0;
        goto LAB_001930b5;
      }
      this_00 = local_e8;
      std::shared_ptr<nuraft::buffer>::shared_ptr
                (in_stack_fffffffffffffe90,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe88);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                  *)0x192f0a);
      std::shared_ptr<nuraft::buffer>::shared_ptr
                (in_stack_fffffffffffffe90,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffe88);
      peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x192f28);
      sVar6 = nuraft::buffer::size(peVar5);
      peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x192f44);
      sVar7 = nuraft::buffer::size(peVar5);
      if (sVar6 == sVar7) {
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x192fba);
        nuraft::buffer::pos(this_00,sVar7);
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x192fd5);
        nuraft::buffer::pos(this_00,sVar7);
        peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x192ff0);
        pbVar8 = nuraft::buffer::data(peVar5);
        peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19300c);
        pbVar9 = nuraft::buffer::data(peVar5);
        peVar5 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x193028);
        in_stack_fffffffffffffe90 = (shared_ptr<nuraft::buffer> *)nuraft::buffer::size(peVar5);
        iVar2 = memcmp(pbVar8,pbVar9,(size_t)in_stack_fffffffffffffe90);
        if (iVar2 == 0) {
          local_a4 = 0;
        }
        else {
          local_1 = 0;
          local_a4 = 1;
        }
      }
      else {
        local_1 = 0;
        local_a4 = 1;
      }
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x19307d);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x19308a);
      if (local_a4 != 0) goto LAB_001930b5;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>::
      operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>
                  *)in_stack_fffffffffffffe90);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_001930b5:
  return (bool)(local_1 & 1);
}

Assistant:

bool isSame(const TestSm& with, bool check_precommit = false) {
        // NOTE:
        //   To avoid false alarm by TSAN (regarding lock order inversion),
        //   always grab lock of the smaller address one first.
        if (this < &with) {
            std::lock_guard<std::mutex> ll_mine(dataLock);
            std::lock_guard<std::mutex> ll_with(with.dataLock);
        } else {
            std::lock_guard<std::mutex> ll_with(with.dataLock);
            std::lock_guard<std::mutex> ll_mine(dataLock);
        }

        if (check_precommit) {
            if (preCommits.size() != with.preCommits.size()) return false;
            for (auto& e1: preCommits) {
                auto e2 = with.preCommits.find(e1.first);
                if (e2 == with.preCommits.end()) return false;

                ptr<buffer> e1_buf = e1.second;
                ptr<buffer> e2_buf = e2->second;
                if (e1_buf->size() != e2_buf->size()) return false;

                e1_buf->pos(0);
                e2_buf->pos(0);
                if ( memcmp( e1_buf->data(),
                             e2_buf->data(),
                             e1_buf->size() ) ) return false;
            }
        }

        if (commits.size() != with.commits.size()) return false;
        for (auto& e1: commits) {
            auto e2 = with.commits.find(e1.first);
            if (e2 == with.commits.end()) return false;

            ptr<buffer> e1_buf = e1.second;
            ptr<buffer> e2_buf = e2->second;
            if (e1_buf->size() != e2_buf->size()) return false;

            e1_buf->pos(0);
            e2_buf->pos(0);
            if ( memcmp( e1_buf->data(),
                         e2_buf->data(),
                         e1_buf->size() ) ) return false;
        }

        return true;
    }